

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::
     DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,
               OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16_t *local_30;
  char16 *heapTag;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCodeAsmJs op_local;
  
  local_30 = (char16_t *)0x0;
  switch(data->ViewType) {
  case TYPE_INT8:
  case TYPE_INT8_TO_INT64:
    local_30 = L"HEAP8";
    break;
  case TYPE_UINT8:
  case TYPE_UINT8_TO_INT64:
    local_30 = L"HEAPU8";
    break;
  case TYPE_INT16:
  case TYPE_INT16_TO_INT64:
    local_30 = L"HEAP16";
    break;
  case TYPE_UINT16:
  case TYPE_UINT16_TO_INT64:
    local_30 = L"HEAPU16";
    break;
  case TYPE_INT32:
  case TYPE_INT32_TO_INT64:
    local_30 = L"HEAP32";
    break;
  case TYPE_UINT32:
  case TYPE_UINT32_TO_INT64:
    local_30 = L"HEAPU32";
    break;
  case TYPE_FLOAT32:
    local_30 = L"HEAPF32";
    break;
  case TYPE_FLOAT64:
    local_30 = L"HEAPF64";
    break;
  case TYPE_INT64:
    local_30 = L"HEAPI64";
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x40e,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  switch(op) {
  case Simd128_LdArr_I16:
    DumpInt8x16Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_I16:
    DumpInt8x16Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_I16:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt8x16Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_I16:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt8x16Reg((uint)data->Value);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x432,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    break;
  case Simd128_LdArr_I4:
    DumpInt32x4Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_I4:
    DumpInt32x4Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArr_F4:
    DumpFloat32x4Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_F4:
    DumpFloat32x4Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_I4:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt32x4Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_I4:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt32x4Reg((uint)data->Value);
    break;
  case Simd128_StArr_F4:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpFloat32x4Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_F4:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpFloat32x4Reg((uint)data->Value);
    break;
  case Simd128_LdArr_I8:
    DumpInt16x8Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_I8:
    DumpInt16x8Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_I8:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt16x8Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_I8:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpInt16x8Reg((uint)data->Value);
    break;
  case Simd128_LdArr_U4:
    DumpUint32x4Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_U4:
    DumpUint32x4Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_U4:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint32x4Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_U4:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint32x4Reg((uint)data->Value);
    break;
  case Simd128_LdArr_U8:
    DumpUint16x8Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_U8:
    DumpUint16x8Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_U8:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint16x8Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_U8:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint16x8Reg((uint)data->Value);
    break;
  case Simd128_LdArr_U16:
    DumpUint8x16Reg((uint)data->Value);
    Output::Print(L"= %s[I%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_LdArrConst_U16:
    DumpUint8x16Reg((uint)data->Value);
    Output::Print(L"= %s[%d] ",local_30,(ulong)data->SlotIndex);
    break;
  case Simd128_StArr_U16:
    Output::Print(L"%s[I%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint8x16Reg((uint)data->Value);
    break;
  case Simd128_StArrConst_U16:
    Output::Print(L"%s[%d] = ",local_30,(ulong)data->SlotIndex);
    DumpUint8x16Reg((uint)data->Value);
  }
  Output::Print(L" %d bytes ",(ulong)(uint)(int)data->DataWidth);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmSimdTypedArr(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        const char16* heapTag = nullptr;

        switch (data->ViewType)
        {
        case ArrayBufferView::TYPE_INT8:
        case ArrayBufferView::TYPE_INT8_TO_INT64:
            heapTag = _u("HEAP8"); break;
        case ArrayBufferView::TYPE_UINT8:
        case ArrayBufferView::TYPE_UINT8_TO_INT64:
            heapTag = _u("HEAPU8"); break;
        case ArrayBufferView::TYPE_INT16:
        case ArrayBufferView::TYPE_INT16_TO_INT64:
            heapTag = _u("HEAP16"); break;
        case ArrayBufferView::TYPE_UINT16:
        case ArrayBufferView::TYPE_UINT16_TO_INT64:
            heapTag = _u("HEAPU16"); break;
        case ArrayBufferView::TYPE_INT32:
        case ArrayBufferView::TYPE_INT32_TO_INT64:
            heapTag = _u("HEAP32"); break;
        case ArrayBufferView::TYPE_UINT32:
        case ArrayBufferView::TYPE_UINT32_TO_INT64:
            heapTag = _u("HEAPU32"); break;
        case ArrayBufferView::TYPE_FLOAT32:
            heapTag = _u("HEAPF32"); break;
        case ArrayBufferView::TYPE_FLOAT64:
            heapTag = _u("HEAPF64"); break;
        case ArrayBufferView::TYPE_INT64:
            heapTag = _u("HEAPI64"); break;
        default:
            Assert(false);
            __assume(false);
            break;
        }

#define SIMD_DUMP_ARR_I4 DumpInt32x4Reg
#define SIMD_DUMP_ARR_I8 DumpInt16x8Reg
#define SIMD_DUMP_ARR_I16 DumpInt8x16Reg
#define SIMD_DUMP_ARR_U4 DumpUint32x4Reg
#define SIMD_DUMP_ARR_U8 DumpUint16x8Reg
#define SIMD_DUMP_ARR_U16 DumpUint8x16Reg
#define SIMD_DUMP_ARR_F4 DumpFloat32x4Reg
#define SIMD_DUMP_ARR_D2 DumpFloat64x2Reg
#define SIMD_DUMP_ARR_I2 DumpInt64x2Reg
#define SIMD_DUMP_REG(type) SIMD_DUMP_ARR_##type(data->Value)
#define SIMD_DUMP_ARR_VALUE(type) \
        case OpCodeAsmJs::Simd128_LdArr_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[I%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_LdArrConst_##type:\
            SIMD_DUMP_REG(type); Output::Print(_u("= %s[%d] "), heapTag, data->SlotIndex); break;\
        case OpCodeAsmJs::Simd128_StArr_##type:\
            Output::Print(_u("%s[I%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\
        case OpCodeAsmJs::Simd128_StArrConst_##type:\
            Output::Print(_u("%s[%d] = "), heapTag, data->SlotIndex); SIMD_DUMP_REG(type); break;\

        switch (op)
        {
            SIMD_DUMP_ARR_VALUE(I4)
            SIMD_DUMP_ARR_VALUE(I8)
            SIMD_DUMP_ARR_VALUE(I16)
            SIMD_DUMP_ARR_VALUE(U4)
            SIMD_DUMP_ARR_VALUE(U8)
            SIMD_DUMP_ARR_VALUE(U16)
            SIMD_DUMP_ARR_VALUE(F4)
            //SIMD_DUMP_ARR_VALUE(D2)
        default:
            Assert(false);
            __assume(false);
            break;
        }

        // data width
        Output::Print(_u(" %d bytes "), data->DataWidth);
    }